

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_call_lightning(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *pCVar3;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var4;
  int dam;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  undefined1 in_stack_000012a2;
  undefined1 in_stack_000012a3;
  int in_stack_000012a4;
  int in_stack_000012a8;
  int in_stack_000012ac;
  CHAR_DATA *in_stack_000012b0;
  CHAR_DATA *in_stack_000012b8;
  int in_stack_000012d8;
  int in_stack_000012e0;
  char *in_stack_000012e8;
  char *in_stack_00002330;
  CHAR_DATA *in_stack_00002338;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  CHAR_DATA *in_stack_ffffffffffffff40;
  ulong uVar5;
  int dam_type;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  
  bVar1 = is_affected(in_RDX,(int)gsn_call_lightning);
  if (bVar1) {
    send_to_char((char *)in_stack_ffffffffffffff40,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    pCVar3 = get_char_world(in_stack_00002338,in_stack_00002330);
    if (((pCVar3 == (CHAR_DATA *)0x0) || (in_RDX->in_room->area != pCVar3->in_room->area)) ||
       (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
       bVar1)) {
      send_to_char((char *)in_stack_ffffffffffffff40,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else if (pCVar3 == in_RDX) {
      send_to_char((char *)in_stack_ffffffffffffff40,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else if (in_RDX->in_room->area->sky < 3) {
      send_to_char((char *)in_stack_ffffffffffffff40,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    else {
      uVar5 = pCVar3->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x6e17fe);
      if (((uVar5 & (long)_Var4) == 0) && (pCVar3->in_room->sector_type != 7)) {
        bVar1 = is_safe((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        dam_type = (int)(uVar5 >> 0x20);
        if (!bVar1) {
          act((char *)in_stack_ffffffffffffff40,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0);
          act((char *)in_stack_ffffffffffffff40,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
              (void *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
              (void *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),0);
          init_affect((AFFECT_DATA *)0x6e18bb);
          affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                         (AFFECT_DATA *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          do_myell(in_stack_ffffffffffffff40,
                   (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          iVar2 = dice(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          saves_spell(in_stack_ffffffffffffff70,
                      (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff68),dam_type);
          dice(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
          damage_new(in_stack_000012b8,in_stack_000012b0,in_stack_000012ac,in_stack_000012a8,
                     in_stack_000012a4,(bool)in_stack_000012a3,(bool)in_stack_000012a2,
                     in_stack_000012d8,in_stack_000012e0,in_stack_000012e8);
        }
      }
      else {
        send_to_char((char *)in_stack_ffffffffffffff40,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
    }
  }
  return;
}

Assistant:

void spell_call_lightning(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;
	AFFECT_DATA af;
	int dam;

	if (is_affected(ch, gsn_call_lightning))
	{
		send_to_char("You have not yet recovered from your prior casting.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, target_name);

	if (victim == nullptr || (ch->in_room->area != victim->in_room->area || is_npc(victim)))
	{
		send_to_char("Call lightning on whom?\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("That's really not a good idea.\n\r", ch);
		return;
	}

	if (ch->in_room->area->sky < WeatherCondition::Drizzle)
	{
		send_to_char("The weather is not suitable for calling lightning.\n\r", ch);
		return;
	}

	if (IS_SET(victim->in_room->room_flags, ROOM_INDOORS) || victim->in_room->sector_type == SECT_INSIDE)
	{
		send_to_char("Lightning cannot strike indoors.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	act("You call forth a bolt of lightning upon $N's location!", ch, nullptr, victim, TO_CHAR);
	act("A bolt of lightning streaks down from the clouds above!", ch, nullptr, victim, TO_VICT);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.type = sn;
	af.level = level;
	af.duration = 36;
	af.location = 0;
	af.modifier = 0;
	affect_to_char(ch, &af);

	do_myell(victim, "Argh, I've been struck by lightning!", nullptr);

	dam = dice(level, 8);

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_new(ch, victim, dice(level, 8), sn, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "The lightning strike*");
}